

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

COVER_epoch_info_t COVER_computeEpochs(U32 maxDictSize,U32 nbDmers,U32 k,U32 passes)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  
  uVar2 = k * 10;
  if ((uint)((ulong)maxDictSize / (ulong)k) < passes) {
    uVar1 = 1;
  }
  else {
    uVar1 = ((ulong)maxDictSize / (ulong)k) / (ulong)passes;
  }
  uVar3 = nbDmers / uVar1;
  if ((uint)uVar3 < uVar2) {
    if (nbDmers <= uVar2) {
      uVar2 = nbDmers;
    }
    uVar3 = (ulong)uVar2;
    uVar1 = nbDmers / uVar3;
    if (nbDmers < (int)uVar1 * uVar2) {
      __assert_fail("epochs.size * epochs.num <= nbDmers",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0xb232,"COVER_epoch_info_t COVER_computeEpochs(U32, U32, U32, U32)");
    }
  }
  else if (nbDmers < (uint)uVar3 * (int)uVar1) {
    __assert_fail("epochs.size * epochs.num <= nbDmers",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0xb22d,"COVER_epoch_info_t COVER_computeEpochs(U32, U32, U32, U32)");
  }
  return (COVER_epoch_info_t)(uVar1 | uVar3 << 0x20);
}

Assistant:

COVER_epoch_info_t COVER_computeEpochs(U32 maxDictSize,
                                       U32 nbDmers, U32 k, U32 passes)
{
  const U32 minEpochSize = k * 10;
  COVER_epoch_info_t epochs;
  epochs.num = MAX(1, maxDictSize / k / passes);
  epochs.size = nbDmers / epochs.num;
  if (epochs.size >= minEpochSize) {
      assert(epochs.size * epochs.num <= nbDmers);
      return epochs;
  }
  epochs.size = MIN(minEpochSize, nbDmers);
  epochs.num = nbDmers / epochs.size;
  assert(epochs.size * epochs.num <= nbDmers);
  return epochs;
}